

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_int64(char **pBuf,int64 *value)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint c;
  uint64 result2;
  uint64 result8;
  ulong uStack_30;
  bool negative;
  uint64 result;
  char *p;
  int64 *value_local;
  char **pBuf_local;
  
  *value = 0;
  result = (uint64)*pBuf;
  while( true ) {
    bVar2 = false;
    if (*(char *)result != '\0') {
      iVar1 = isspace((int)*(char *)result);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    result = result + 1;
  }
  uStack_30 = 0;
  bVar2 = false;
  iVar1 = isdigit((int)*(char *)result);
  if (iVar1 == 0) {
    if (*(char *)result != '-') {
      return false;
    }
    bVar2 = true;
    result = result + 1;
  }
  while( true ) {
    bVar3 = false;
    if (*(char *)result != '\0') {
      iVar1 = isdigit((int)*(char *)result);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) {
      if (bVar2) {
        if (0x8000000000000000 < uStack_30) {
          *value = 0;
          return false;
        }
        *value = -uStack_30;
      }
      else {
        if (0x7fffffffffffffff < uStack_30) {
          *value = 0;
          return false;
        }
        *value = uStack_30;
      }
      *pBuf = (char *)result;
      return true;
    }
    if ((uStack_30 & 0xe000000000000000) != 0) {
      return false;
    }
    if (uStack_30 * -8 - 1 < uStack_30 * 2) break;
    if (uStack_30 * -10 - 1 < (ulong)((int)*(char *)result - 0x30U)) {
      return false;
    }
    uStack_30 = (ulong)((int)*(char *)result - 0x30U) + uStack_30 * 10;
    result = result + 1;
  }
  return false;
}

Assistant:

bool string_to_int64(const char*& pBuf, int64& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint64 result = 0;
        bool negative = false;

        if (!isdigit(*p))
        {
            if (p[0] == '-')
            {
                negative = true;
                p++;
            }
            else
            {
                return false;
            }
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE000000000000000ULL)
            {
                return false;
            }

            const uint64 result8 = result << 3U;
            const uint64 result2 = result << 1U;

            if (result2 > (0xFFFFFFFFFFFFFFFFULL - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFFFFFFFFFULL - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        if (negative)
        {
            if (result > 0x8000000000000000ULL)
            {
                value = 0;
                return false;
            }
            value = -static_cast<int64>(result);
        }
        else
        {
            if (result > 0x7FFFFFFFFFFFFFFFULL)
            {
                value = 0;
                return false;
            }
            value = static_cast<int64>(result);
        }

        pBuf = p;

        return true;
    }